

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QTransform * __thiscall
QGraphicsView::viewportTransform(QTransform *__return_storage_ptr__,QGraphicsView *this)

{
  long lVar1;
  QGraphicsViewPrivate *this_00;
  qint64 qVar2;
  qint64 qVar3;
  long lVar4;
  qreal *pqVar5;
  QTransform *pQVar6;
  qreal *pqVar7;
  QTransform *pQVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QTransform moveMatrix;
  
  bVar9 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pqVar5 = (qreal *)&DAT_0067b698;
  pqVar7 = (qreal *)&moveMatrix;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pqVar7 = *pqVar5;
    pqVar5 = pqVar5 + 1;
    pqVar7 = pqVar7 + 1;
  }
  qVar2 = QGraphicsViewPrivate::horizontalScroll(this_00);
  qVar3 = QGraphicsViewPrivate::verticalScroll(this_00);
  QTransform::fromTranslate((double)-qVar2,(double)-qVar3);
  if ((this_00->field_0x300 & 0x10) == 0) {
    QTransform::operator*(__return_storage_ptr__,&this_00->matrix);
  }
  else {
    pQVar6 = &moveMatrix;
    pQVar8 = __return_storage_ptr__;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      pQVar8->m_matrix[0][0] = pQVar6->m_matrix[0][0];
      pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTransform QGraphicsView::viewportTransform() const
{
    Q_D(const QGraphicsView);
    QTransform moveMatrix = QTransform::fromTranslate(-d->horizontalScroll(), -d->verticalScroll());
    return d->identityMatrix ? moveMatrix : d->matrix * moveMatrix;
}